

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue * __thiscall
RPCArg::MatchesType(UniValue *__return_storage_ptr__,RPCArg *this,UniValue *request)

{
  string_view func;
  variant_alternative_t<0UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar1;
  NonFatalCheckError *this_00;
  VType t;
  VType t_00;
  char **in_R8;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  char *local_58;
  char *local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_opts).skip_type_check == true) {
switchD_00d95e14_caseD_7:
    local_48._M_dataplus._M_p._0_1_ = 1;
    ::UniValue::UniValue<bool,_bool,_true>(__return_storage_ptr__,(bool *)&local_48);
  }
  else {
    if (*(__index_type *)
         ((long)&(this->m_fallback).
                 super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                 .
                 super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
         + 0x58) == '\0') {
      pvVar1 = std::get<0ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&this->m_fallback);
      t_00 = request->typ;
      if (*pvVar1 == NO || t_00 != VNULL) goto LAB_00d95df3;
      goto switchD_00d95e14_caseD_7;
    }
    t_00 = request->typ;
    if (t_00 == VNULL) goto switchD_00d95e14_caseD_7;
LAB_00d95df3:
    t = VSTR;
    switch(this->m_type) {
    case OBJ:
    case OBJ_NAMED_PARAMS:
    case OBJ_USER_KEYS:
      t = VOBJ;
      break;
    case ARR:
      t = VARR;
      break;
    case STR:
    case STR_HEX:
      break;
    case NUM:
      t = VNUM;
      break;
    case BOOL:
      t = VBOOL;
      break;
    case AMOUNT:
    case RANGE:
      goto switchD_00d95e14_caseD_7;
    default:
      this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)0xc;
      local_48._M_string_length = 0x1140282;
      func._M_str = "ExpectedType";
      func._M_len = 0xc;
      msg._M_str = "Unreachable code reached (non-fatal)";
      msg._M_len = 0x24;
      file._M_str = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
      file._M_len = 0x55;
      NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x385,func);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00d95f5d;
    }
    if (t == t_00) goto switchD_00d95e14_caseD_7;
    local_50 = uvTypeName(t_00);
    local_58 = uvTypeName(t);
    tinyformat::format<char_const*,char_const*>
              (&local_48,(tinyformat *)"JSON value of type %s is not of expected type %s",
               (char *)&local_50,&local_58,in_R8);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00d95f5d:
  __stack_chk_fail();
}

Assistant:

UniValue RPCArg::MatchesType(const UniValue& request) const
{
    if (m_opts.skip_type_check) return true;
    if (IsOptional() && request.isNull()) return true;
    const auto exp_type{ExpectedType(m_type)};
    if (!exp_type) return true; // nothing to check

    if (*exp_type != request.getType()) {
        return strprintf("JSON value of type %s is not of expected type %s", uvTypeName(request.getType()), uvTypeName(*exp_type));
    }
    return true;
}